

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall
VmaBlockBufferImageGranularity::FinishValidation
          (VmaBlockBufferImageGranularity *this,ValidationContext *ctx)

{
  uint16_t *__ptr;
  VkAllocationCallbacks *pVVar1;
  ulong uVar2;
  
  if (this->m_BufferImageGranularity < 0x101) {
    return true;
  }
  __ptr = ctx->pageAllocs;
  if ((ulong)this->m_RegionCount == 0) {
    if (__ptr == (uint16_t *)0x0) goto LAB_001b6d06;
  }
  else {
    uVar2 = 0;
    do {
      if (__ptr[uVar2] != this->m_RegionInfo[uVar2].allocCount) {
        return false;
      }
      uVar2 = uVar2 + 1;
    } while (this->m_RegionCount != uVar2);
  }
  pVVar1 = ctx->allocCallbacks;
  if ((pVVar1 == (VkAllocationCallbacks *)0x0) || (pVVar1->pfnFree == (PFN_vkFreeFunction)0x0)) {
    free(__ptr);
  }
  else {
    (*pVVar1->pfnFree)(pVVar1->pUserData,__ptr);
  }
LAB_001b6d06:
  ctx->pageAllocs = (uint16_t *)0x0;
  return true;
}

Assistant:

bool VmaBlockBufferImageGranularity::FinishValidation(ValidationContext& ctx) const
{
    // Check proper page structure
    if (IsEnabled())
    {
        VMA_ASSERT(ctx.pageAllocs != VMA_NULL && "Validation context not initialized!");

        for (uint32_t page = 0; page < m_RegionCount; ++page)
        {
            VMA_VALIDATE(ctx.pageAllocs[page] == m_RegionInfo[page].allocCount);
        }
        vma_delete_array(ctx.allocCallbacks, ctx.pageAllocs, m_RegionCount);
        ctx.pageAllocs = VMA_NULL;
    }
    return true;
}